

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern-computer.cpp
# Opt level: O3

void __thiscall mahjong::PatternComputer::~PatternComputer(PatternComputer *this)

{
  pointer mem;
  
  this->_vptr_PatternComputer = (_func_int **)&PTR__PatternComputer_001dfe00;
  mem = (this->highest_wining_hand).tiles.
        super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
        super__Vector_impl_data._M_start;
  if (mem != (pointer)0x0) {
    operator_delete(mem,(long)(this->highest_wining_hand).tiles.
                              super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage - (long)mem);
  }
  std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::~vector
            (&(this->highest_wining_hand).melds);
  std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>::~vector
            (&(this->highest_wining_hand).pairs);
  std::
  _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
  ::~_Rb_tree(&(this->highest_patterns)._M_t);
  std::
  vector<std::unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>,_std::allocator<std::unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>_>_>
  ::~vector(&this->recognizers);
  return;
}

Assistant:

void PatternComputer::compute(WiningPatterns& out_patterns, WiningHand& out_wining_hand)
{
	highest_patterns.clear();

	WiningHandCollator c;
	for (const auto& h : c.collate(hand))
	{
		resetRecognizer();

		check(h);

		const auto& patterns = recognize();
		setHighest(h, patterns);
	}

	special(hand);

	out_patterns = highest_patterns;
	out_wining_hand = highest_wining_hand;
}